

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatatypeValidatorFactory.cpp
# Opt level: O3

DatatypeValidator * __thiscall
xercesc_4_0::DatatypeValidatorFactory::createDatatypeValidator
          (DatatypeValidatorFactory *this,XMLCh *typeName,
          RefVectorOf<xercesc_4_0::DatatypeValidator> *validators,int finalSet,bool userDefined,
          MemoryManager *userManager)

{
  XMLSize_t XVar1;
  bool bVar2;
  int iVar3;
  UnionDatatypeValidator *this_00;
  RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *this_01;
  undefined4 extraout_var;
  DatatypeValidator *pDVar4;
  ValidatorType VVar5;
  ValidatorType VVar6;
  XMLSize_t XVar7;
  bool bVar8;
  bool bVar9;
  MemoryManager *manager;
  XMLSize_t i;
  bool bVar10;
  bool bVar11;
  
  if (validators == (RefVectorOf<xercesc_4_0::DatatypeValidator> *)0x0) {
    this_00 = (UnionDatatypeValidator *)0x0;
  }
  else {
    manager = userManager;
    if (!userDefined) {
      manager = XMLPlatformUtils::fgMemoryManager;
    }
    this_00 = (UnionDatatypeValidator *)XMemory::operator_new(0x80,manager);
    UnionDatatypeValidator::UnionDatatypeValidator(this_00,validators,finalSet,manager);
    this_01 = fBuiltInRegistry;
    if ((userDefined) &&
       (this_01 = this->fUserDefinedRegistry,
       this->fUserDefinedRegistry ==
       (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)0x0)) {
      this_01 = (RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher> *)
                XMemory::operator_new(0x38,userManager);
      this_01->fMemoryManager = userManager;
      this_01->fAdoptedElems = true;
      this_01->fBucketList = (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> **)0x0;
      this_01->fHashModulus = 0x1d;
      this_01->fInitialModulus = 0x1d;
      this_01->fCount = 0;
      iVar3 = (*userManager->_vptr_MemoryManager[3])(userManager,0xe8);
      this_01->fBucketList =
           (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> **)CONCAT44(extraout_var,iVar3);
      XVar1 = this_01->fHashModulus;
      if (XVar1 != 0) {
        XVar7 = 0;
        do {
          this_01->fBucketList[XVar7] =
               (RefHashTableBucketElem<xercesc_4_0::DatatypeValidator> *)0x0;
          XVar7 = XVar7 + 1;
        } while (XVar1 != XVar7);
      }
      this->fUserDefinedRegistry = this_01;
    }
    RefHashTableOf<xercesc_4_0::DatatypeValidator,_xercesc_4_0::StringHasher>::put
              (this_01,typeName,(DatatypeValidator *)this_00);
    DatatypeValidator::setTypeName((DatatypeValidator *)this_00,typeName);
    XVar1 = (validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>).fCurCount;
    if (XVar1 == 0) {
      (this_00->super_DatatypeValidator).fOrdered = ORDERED_PARTIAL;
      (this_00->super_DatatypeValidator).fBounded = true;
      (this_00->super_DatatypeValidator).fNumeric = true;
      bVar8 = true;
    }
    else {
      pDVar4 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                         (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,0);
      VVar5 = pDVar4->fType;
      if (pDVar4->fType - ID < 3) {
        VVar5 = String;
      }
      bVar10 = VVar5 != AnySimpleType;
      bVar8 = true;
      XVar7 = 0;
      bVar2 = true;
      bVar9 = true;
      bVar11 = true;
      do {
        if (bVar10) {
          pDVar4 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                             (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                              XVar7);
          VVar6 = String;
          if (2 < pDVar4->fType - ID) {
            VVar6 = pDVar4->fType;
          }
          bVar10 = VVar5 == VVar6;
          if (bVar11) {
LAB_002f5930:
            pDVar4 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                               (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                                XVar7);
            bVar11 = pDVar4->fOrdered == ORDERED_FALSE;
          }
        }
        else {
          if (bVar11) goto LAB_002f5930;
          if (((bVar9 == false) && (bVar2 == false)) && (bVar8 == false)) break;
        }
        if ((bVar9) &&
           (pDVar4 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                               (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                                XVar7), pDVar4->fNumeric == false)) {
          bVar9 = false;
        }
        if (bVar2) {
          pDVar4 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                             (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                              XVar7);
          if (pDVar4->fBounded == true) {
            pDVar4 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                               (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                                XVar7);
            VVar6 = String;
            if (2 < pDVar4->fType - ID) {
              VVar6 = pDVar4->fType;
            }
            if (VVar5 == VVar6) goto LAB_002f59a5;
          }
          bVar2 = false;
        }
LAB_002f59a5:
        if ((bVar8) &&
           (pDVar4 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                               (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,
                                XVar7), pDVar4->fFinite == false)) {
          bVar8 = false;
        }
        XVar7 = XVar7 + 1;
      } while (XVar1 != XVar7);
      if (bVar10) {
        pDVar4 = BaseRefVectorOf<xercesc_4_0::DatatypeValidator>::elementAt
                           (&validators->super_BaseRefVectorOf<xercesc_4_0::DatatypeValidator>,0);
        (this_00->super_DatatypeValidator).fOrdered = pDVar4->fOrdered;
      }
      else if (bVar11) {
        (this_00->super_DatatypeValidator).fOrdered = ORDERED_FALSE;
      }
      else {
        (this_00->super_DatatypeValidator).fOrdered = ORDERED_PARTIAL;
      }
      (this_00->super_DatatypeValidator).fNumeric = bVar9;
      (this_00->super_DatatypeValidator).fBounded = bVar2;
    }
    (this_00->super_DatatypeValidator).fFinite = bVar8;
  }
  return &this_00->super_DatatypeValidator;
}

Assistant:

DatatypeValidator* DatatypeValidatorFactory::createDatatypeValidator
(
      const XMLCh* const                    typeName
    , RefVectorOf<DatatypeValidator>* const validators
    , const int                             finalSet
    , const bool                            userDefined
    , MemoryManager* const                  userManager
)
{
    if (validators == 0)
        return 0;

    DatatypeValidator* datatypeValidator = 0;
    MemoryManager* const manager = (userDefined)
        ? userManager : XMLPlatformUtils::fgMemoryManager;

    datatypeValidator = new (manager) UnionDatatypeValidator(validators, finalSet, manager);

    if (datatypeValidator != 0) {

        if (userDefined) {

            if (!fUserDefinedRegistry) {
                fUserDefinedRegistry = new (userManager) RefHashTableOf<DatatypeValidator>(29, userManager);
            }

            fUserDefinedRegistry->put((void *)typeName, datatypeValidator);
        }
        else {
            fBuiltInRegistry->put((void *)typeName, datatypeValidator);
        }
        datatypeValidator->setTypeName(typeName);

        // Set PSVI information for Ordered, Numeric, Bounded & Finite
        XMLSize_t valSize = validators->size();
        if (valSize)
        {
            DatatypeValidator::ValidatorType ancestorId = getPrimitiveDV(validators->elementAt(0)->getType());

            // For a union the ORDERED {value} is partial unless one of the following:
            // 1. If every member of {member type definitions} is derived from a common ancestor other than the simple ur-type, then {value} is the same as that ancestor's ordered facet.
            // 2. If every member of {member type definitions} has a {value} of false for the ordered facet, then {value} is false.
            bool allOrderedFalse = true;
            bool commonAnc = ancestorId != DatatypeValidator::AnySimpleType;
            bool allNumeric = true;
            bool allBounded = true;
            bool allFinite  = true;

            for(XMLSize_t i = 0 ; (i < valSize) && (commonAnc || allOrderedFalse || allNumeric || allBounded || allFinite); i++)
            {
                // for the other member types, check whether the value is false
                // and whether they have the same ancestor as the first one
                if (commonAnc)
                    commonAnc = ancestorId == getPrimitiveDV(validators->elementAt(i)->getType());
                if (allOrderedFalse)
                    allOrderedFalse = validators->elementAt(i)->getOrdered() == XSSimpleTypeDefinition::ORDERED_FALSE;

                if (allNumeric && !validators->elementAt(i)->getNumeric())
                {
                    allNumeric = false;
                }
                if (allBounded && (!validators->elementAt(i)->getBounded() ||
                                   ancestorId != getPrimitiveDV(validators->elementAt(i)->getType())))
                {
                    allBounded = false;
                }
                if (allFinite && !validators->elementAt(i)->getFinite())
                {
                    allFinite = false;
                }
            }
            if (commonAnc)
            {
                datatypeValidator->setOrdered(validators->elementAt(0)->getOrdered());
            }
            else if (allOrderedFalse)
            {
                datatypeValidator->setOrdered(XSSimpleTypeDefinition::ORDERED_FALSE);
            }
            else
            {
                datatypeValidator->setOrdered(XSSimpleTypeDefinition::ORDERED_PARTIAL);
            }
            datatypeValidator->setNumeric(allNumeric);
            datatypeValidator->setBounded(allBounded);
            datatypeValidator->setFinite(allFinite);
        }
        else // size = 0
        {
            datatypeValidator->setOrdered(XSSimpleTypeDefinition::ORDERED_PARTIAL);
            datatypeValidator->setNumeric(true);
            datatypeValidator->setBounded(true);
            datatypeValidator->setFinite(true);
        }
    }
    return datatypeValidator;
}